

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lib583.c
# Opt level: O0

int test(char *URL)

{
  undefined8 uVar1;
  CURLcode CVar2;
  undefined8 uVar3;
  long lVar4;
  CURLMcode ec_9;
  CURLMcode ec_8;
  CURLcode ec_7;
  CURLcode ec_6;
  CURLcode ec_5;
  CURLcode ec_4;
  CURLcode ec_3;
  CURLcode ec_2;
  CURLcode ec_1;
  CURLcode ec;
  CURLMcode res;
  CURL *curl;
  CURLM *multiHandle;
  char *pcStack_18;
  int stillRunning;
  char *URL_local;
  
  _ec = 0;
  ec_1 = CURLE_OK;
  pcStack_18 = URL;
  CVar2 = curl_global_init(3);
  uVar1 = _stderr;
  if (CVar2 != CURLE_OK) {
    uVar3 = curl_easy_strerror(CVar2);
    curl_mfprintf(uVar1,"%s:%d curl_global_init() failed, with code %d (%s)\n",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/mitls[P]mitls-curl/tests/libtest/lib583.c"
                  ,0x28,CVar2,uVar3);
    ec_1 = CVar2;
  }
  if (ec_1 == CURLE_OK) {
    lVar4 = curl_multi_init();
    if (lVar4 == 0) {
      curl_mfprintf(_stderr,"%s:%d curl_multi_init() failed\n",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/mitls[P]mitls-curl/tests/libtest/lib583.c"
                    ,0x2a);
      ec_1 = CURLE_USE_SSL_FAILED|CURLE_SSL_CIPHER;
    }
    if (ec_1 == CURLE_OK) {
      _ec = curl_easy_init();
      if (_ec == 0) {
        curl_mfprintf(_stderr,"%s:%d curl_easy_init() failed\n",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/mitls[P]mitls-curl/tests/libtest/lib583.c"
                      ,0x2c);
        ec_1 = CURLE_USE_SSL_FAILED|CURLE_PEER_FAILED_VERIFICATION;
      }
      if (ec_1 == CURLE_OK) {
        CVar2 = curl_easy_setopt(_ec,0x2715,libtest_arg2);
        uVar1 = _stderr;
        if (CVar2 != CURLE_OK) {
          uVar3 = curl_easy_strerror(CVar2);
          curl_mfprintf(uVar1,"%s:%d curl_easy_setopt() failed, with code %d (%s)\n",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/mitls[P]mitls-curl/tests/libtest/lib583.c"
                        ,0x2e,CVar2,uVar3);
          ec_1 = CVar2;
        }
        if (ec_1 == CURLE_OK) {
          CVar2 = curl_easy_setopt(_ec,0x27a8,"curl_client_key.pub");
          uVar1 = _stderr;
          if (CVar2 != CURLE_OK) {
            uVar3 = curl_easy_strerror(CVar2);
            curl_mfprintf(uVar1,"%s:%d curl_easy_setopt() failed, with code %d (%s)\n",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/mitls[P]mitls-curl/tests/libtest/lib583.c"
                          ,0x2f,CVar2,uVar3);
            ec_1 = CVar2;
          }
          if (ec_1 == CURLE_OK) {
            CVar2 = curl_easy_setopt(_ec,0x27a9,"curl_client_key");
            uVar1 = _stderr;
            if (CVar2 != CURLE_OK) {
              uVar3 = curl_easy_strerror(CVar2);
              curl_mfprintf(uVar1,"%s:%d curl_easy_setopt() failed, with code %d (%s)\n",
                            "/workspace/llm4binary/github/license_all_cmakelists_25/mitls[P]mitls-curl/tests/libtest/lib583.c"
                            ,0x30,CVar2,uVar3);
              ec_1 = CVar2;
            }
            if (ec_1 == CURLE_OK) {
              CVar2 = curl_easy_setopt(_ec,0x2e,1);
              uVar1 = _stderr;
              if (CVar2 != CURLE_OK) {
                uVar3 = curl_easy_strerror(CVar2);
                curl_mfprintf(uVar1,"%s:%d curl_easy_setopt() failed, with code %d (%s)\n",
                              "/workspace/llm4binary/github/license_all_cmakelists_25/mitls[P]mitls-curl/tests/libtest/lib583.c"
                              ,0x32,CVar2,uVar3);
                ec_1 = CVar2;
              }
              if (ec_1 == CURLE_OK) {
                CVar2 = curl_easy_setopt(_ec,0x29,1);
                uVar1 = _stderr;
                if (CVar2 != CURLE_OK) {
                  uVar3 = curl_easy_strerror(CVar2);
                  curl_mfprintf(uVar1,"%s:%d curl_easy_setopt() failed, with code %d (%s)\n",
                                "/workspace/llm4binary/github/license_all_cmakelists_25/mitls[P]mitls-curl/tests/libtest/lib583.c"
                                ,0x33,CVar2,uVar3);
                  ec_1 = CVar2;
                }
                if (ec_1 == CURLE_OK) {
                  CVar2 = curl_easy_setopt(_ec,0x2712,pcStack_18);
                  uVar1 = _stderr;
                  if (CVar2 != CURLE_OK) {
                    uVar3 = curl_easy_strerror(CVar2);
                    curl_mfprintf(uVar1,"%s:%d curl_easy_setopt() failed, with code %d (%s)\n",
                                  "/workspace/llm4binary/github/license_all_cmakelists_25/mitls[P]mitls-curl/tests/libtest/lib583.c"
                                  ,0x35,CVar2,uVar3);
                    ec_1 = CVar2;
                  }
                  if (ec_1 == CURLE_OK) {
                    CVar2 = curl_easy_setopt(_ec,0xe,5);
                    uVar1 = _stderr;
                    if (CVar2 != CURLE_OK) {
                      uVar3 = curl_easy_strerror(CVar2);
                      curl_mfprintf(uVar1,"%s:%d curl_easy_setopt() failed, with code %d (%s)\n",
                                    "/workspace/llm4binary/github/license_all_cmakelists_25/mitls[P]mitls-curl/tests/libtest/lib583.c"
                                    ,0x36,CVar2,uVar3);
                      ec_1 = CVar2;
                    }
                    if (ec_1 == CURLE_OK) {
                      CVar2 = curl_multi_add_handle(lVar4,_ec);
                      uVar1 = _stderr;
                      if (CVar2 != CURLE_OK) {
                        uVar3 = curl_multi_strerror(CVar2);
                        curl_mfprintf(uVar1,
                                      "%s:%d curl_multi_add_handle() failed, with code %d (%s)\n",
                                      "/workspace/llm4binary/github/license_all_cmakelists_25/mitls[P]mitls-curl/tests/libtest/lib583.c"
                                      ,0x38,CVar2,uVar3);
                        ec_1 = CVar2;
                      }
                      if (ec_1 == CURLE_OK) {
                        curl_mfprintf(_stderr,"curl_multi_perform()...\n");
                        CVar2 = curl_multi_perform(lVar4,(long)&multiHandle + 4);
                        uVar1 = _stderr;
                        if (CVar2 == CURLE_OK) {
                          if (multiHandle._4_4_ < 0) {
                            curl_mfprintf(_stderr,
                                          "%s:%d curl_multi_perform() succeeded, but returned invalid running_handles value (%d)\n"
                                          ,
                                          "/workspace/llm4binary/github/license_all_cmakelists_25/mitls[P]mitls-curl/tests/libtest/lib583.c"
                                          ,0x3f,multiHandle._4_4_);
                            ec_1 = CURLE_USE_SSL_FAILED|CURLE_SSL_CERTPROBLEM;
                          }
                        }
                        else {
                          uVar3 = curl_multi_strerror(CVar2);
                          curl_mfprintf(uVar1,
                                        "%s:%d curl_multi_perform() failed, with code %d (%s)\n",
                                        "/workspace/llm4binary/github/license_all_cmakelists_25/mitls[P]mitls-curl/tests/libtest/lib583.c"
                                        ,0x3f,CVar2,uVar3);
                          ec_1 = CVar2;
                        }
                        if (ec_1 == CURLE_OK) {
                          curl_mfprintf(_stderr,"curl_multi_perform() succeeded\n");
                          curl_mfprintf(_stderr,"curl_multi_remove_handle()...\n");
                          ec_1 = curl_multi_remove_handle(lVar4,_ec);
                          if (ec_1 == CURLE_OK) {
                            curl_mfprintf(_stderr,"curl_multi_remove_handle() succeeded\n");
                          }
                          else {
                            curl_mfprintf(_stderr,
                                          "curl_multi_remove_handle() failed, with code %d\n",ec_1);
                          }
                        }
                      }
                    }
                  }
                }
              }
            }
          }
        }
      }
    }
    curl_easy_cleanup(_ec);
    curl_multi_cleanup(lVar4);
    curl_global_cleanup();
    URL_local._4_4_ = ec_1;
  }
  else {
    URL_local._4_4_ = ec_1;
  }
  return URL_local._4_4_;
}

Assistant:

int test(char *URL)
{
  int stillRunning;
  CURLM *multiHandle = NULL;
  CURL *curl = NULL;
  CURLMcode res = CURLM_OK;

  global_init(CURL_GLOBAL_ALL);

  multi_init(multiHandle);

  easy_init(curl);

  easy_setopt(curl, CURLOPT_USERPWD, libtest_arg2);
  easy_setopt(curl, CURLOPT_SSH_PUBLIC_KEYFILE, "curl_client_key.pub");
  easy_setopt(curl, CURLOPT_SSH_PRIVATE_KEYFILE, "curl_client_key");

  easy_setopt(curl, CURLOPT_UPLOAD, 1L);
  easy_setopt(curl, CURLOPT_VERBOSE, 1L);

  easy_setopt(curl, CURLOPT_URL, URL);
  easy_setopt(curl, CURLOPT_INFILESIZE, (long)5);

  multi_add_handle(multiHandle, curl);

  /* this tests if removing an easy handle immediately after multi
     perform has been called succeeds or not. */

  fprintf(stderr, "curl_multi_perform()...\n");

  multi_perform(multiHandle, &stillRunning);

  fprintf(stderr, "curl_multi_perform() succeeded\n");

  fprintf(stderr, "curl_multi_remove_handle()...\n");
  res = curl_multi_remove_handle(multiHandle, curl);
  if(res)
    fprintf(stderr, "curl_multi_remove_handle() failed, "
            "with code %d\n", (int)res);
  else
    fprintf(stderr, "curl_multi_remove_handle() succeeded\n");

test_cleanup:

  /* undocumented cleanup sequence - type UB */

  curl_easy_cleanup(curl);
  curl_multi_cleanup(multiHandle);
  curl_global_cleanup();

  return (int)res;
}